

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhdp_interfaces.c
# Opt level: O0

void nhdp_interfaces_cleanup(void)

{
  list_entity *plVar1;
  list_entity *__tempptr_3;
  list_entity *__tempptr_2;
  list_entity *__tempptr_1;
  list_entity *__tempptr;
  nhdp_interface *if_it;
  nhdp_interface *interf;
  
  if_it = (nhdp_interface *)&_interface_tree.list_head.next[-0x16].prev;
  plVar1 = (_interface_tree.list_head.next)->next;
  while( true ) {
    __tempptr = (list_entity *)&plVar1[-0x16].prev;
    if ((if_it->_node).list.prev == _interface_tree.list_head.prev) break;
    if ((if_it->registered & 1U) != 0) {
      nhdp_interface_remove(if_it);
    }
    if_it = (nhdp_interface *)__tempptr;
    plVar1 = plVar1->next;
  }
  oonf_timer_remove(&_interface_hello_timer);
  oonf_timer_remove(&_removed_address_hold_timer);
  oonf_class_remove(&_interface_info);
  oonf_class_remove(&_addr_info);
  return;
}

Assistant:

void
nhdp_interfaces_cleanup(void) {
  struct nhdp_interface *interf, *if_it;

  avl_for_each_element_safe(&_interface_tree, interf, _node, if_it) {
    if (interf->registered) {
      nhdp_interface_remove(interf);
    }
  }

  oonf_timer_remove(&_interface_hello_timer);
  oonf_timer_remove(&_removed_address_hold_timer);
  oonf_class_remove(&_interface_info);
  oonf_class_remove(&_addr_info);
}